

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

bool __thiscall
argstest::ArgumentParser::
Complete<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (ArgumentParser *this,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          it,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             end)

{
  char __rhs;
  pointer pbVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  OptionType OVar5;
  undefined4 extraout_var;
  char *pcVar6;
  undefined4 extraout_var_00;
  ulong uVar7;
  undefined4 extraout_var_01;
  iterator __begin6;
  string *psVar8;
  Matcher *this_01;
  _Alloc_hider this_02;
  iterator __end6;
  iterator __begin4;
  pointer ppCVar9;
  pointer ppFVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  choices;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  string arg;
  string local_a0;
  pointer local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> flags;
  vector<argstest::Command_*,_std::allocator<argstest::Command_*>_> commands;
  NamedBase *this_00;
  
  bVar3 = (bool)(it._M_current + 1 == end._M_current & this->readCompletion);
  if (bVar3 != true) {
    return bVar3;
  }
  iVar4 = (*(this->super_Command).super_Group.super_Base._vptr_Base[8])();
  this_00 = (NamedBase *)CONCAT44(extraout_var,iVar4);
  (*(this->super_Command).super_Group.super_Base._vptr_Base[5])(&commands,this);
  OVar5 = ParseOption(this,it._M_current,true);
  if (commands.super__Vector_base<argstest::Command_*,_std::allocator<argstest::Command_*>_>._M_impl
      .super__Vector_impl_data._M_start ==
      commands.super__Vector_base<argstest::Command_*,_std::allocator<argstest::Command_*>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    if ((this_00 != (NamedBase *)0x0) &&
       (((this_00->super_Base).options & HiddenFromCompletion) == None)) {
      NamedBase::HelpChoices_abi_cxx11_(&choices,this_00,&this->helpParams);
      pbVar1 = choices.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar8 = (string *)
               CONCAT62(choices.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._2_6_,
                        CONCAT11(choices.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                 choices.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._0_1_));
      bVar3 = psVar8 == choices.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
      for (; psVar8 != pbVar1; psVar8 = psVar8 + 1) {
        AddCompletionReply(this,it._M_current,psVar8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&choices);
      if (OVar5 == Positional && bVar3) goto LAB_00193ca4;
    }
  }
  else {
    ppCVar9 = commands.super__Vector_base<argstest::Command_*,_std::allocator<argstest::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((OVar5 == Positional) || ((it._M_current)->_M_string_length == 0)) {
      for (; ppCVar9 !=
             commands.super__Vector_base<argstest::Command_*,_std::allocator<argstest::Command_*>_>.
             _M_impl.super__Vector_impl_data._M_finish; ppCVar9 = ppCVar9 + 1) {
        if ((((*ppCVar9)->super_Group).super_Base.options & HiddenFromCompletion) == None) {
          AddCompletionReply(this,it._M_current,&(*ppCVar9)->name);
        }
      }
      goto LAB_00193ca4;
    }
    for (; ppCVar9 !=
           commands.super__Vector_base<argstest::Command_*,_std::allocator<argstest::Command_*>_>.
           _M_impl.super__Vector_impl_data._M_finish; ppCVar9 = ppCVar9 + 1) {
      if ((((*ppCVar9)->super_Group).super_Base.options & HiddenFromCompletion) == None) {
        AddCompletionReply(this,it._M_current,&(*ppCVar9)->name);
      }
    }
  }
  (*(this->super_Command).super_Group.super_Base._vptr_Base[9])(&flags,this);
  local_80 = flags.super__Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  psVar8 = &this->shortprefix;
  for (ppFVar10 = flags.
                  super__Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppFVar10 != local_80;
      ppFVar10 = ppFVar10 + 1) {
    if ((((*ppFVar10)->super_NamedBase).super_Base.options & HiddenFromCompletion) == None) {
      this_01 = &(*ppFVar10)->matcher;
      Matcher::GetShortOrAny((EitherFlag *)&choices,this_01);
      EitherFlag::str(&arg,(EitherFlag *)&choices,psVar8,&this->longprefix);
      bVar3 = AddCompletionReply(this,it._M_current,&arg);
      std::__cxx11::string::~string((string *)&arg);
      std::__cxx11::string::~string
                ((string *)
                 &choices.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      if (!bVar3) {
        Matcher::GetFlagStrings
                  ((vector<argstest::EitherFlag,_std::allocator<argstest::EitherFlag>_> *)&arg,
                   this_01);
        sVar2 = arg._M_string_length;
        this_02 = arg._M_dataplus;
        do {
          if (this_02._M_p == (pointer)sVar2) break;
          EitherFlag::str((string *)&choices,(EitherFlag *)this_02._M_p,psVar8,&this->longprefix);
          bVar3 = AddCompletionReply(this,it._M_current,(string *)&choices);
          std::__cxx11::string::~string((string *)&choices);
          this_02._M_p = this_02._M_p + 0x28;
        } while (!bVar3);
        std::vector<argstest::EitherFlag,_std::allocator<argstest::EitherFlag>_>::~vector
                  ((vector<argstest::EitherFlag,_std::allocator<argstest::EitherFlag>_> *)&arg);
      }
    }
  }
  if (OVar5 == LongFlag) {
    if ((this->allowJoinedLongValue == true) && ((this->longseparator)._M_string_length != 0)) {
      uVar7 = std::__cxx11::string::find((string *)it._M_current,(ulong)&this->longseparator);
      if (uVar7 != 0xffffffffffffffff) {
        std::__cxx11::string::string((string *)&arg,(string *)it._M_current,0,uVar7);
        std::__cxx11::string::substr((ulong)&local_a0,(ulong)&arg);
        EitherFlag::EitherFlag((EitherFlag *)&choices,&local_a0);
        iVar4 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])(this,&choices);
        std::__cxx11::string::~string
                  ((string *)
                   &choices.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        std::__cxx11::string::~string((string *)&local_a0);
        if ((NamedBase *)CONCAT44(extraout_var_01,iVar4) != (NamedBase *)0x0) {
          NamedBase::HelpChoices_abi_cxx11_
                    (&local_78,(NamedBase *)CONCAT44(extraout_var_01,iVar4),&this->helpParams);
          for (; local_78.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 local_78.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
              local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   local_78.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1) {
            std::operator+(&local_a0,&arg,&this->longseparator);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &choices,&local_a0,
                           local_78.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
            AddCompletionReply(this,it._M_current,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &choices);
            std::__cxx11::string::~string((string *)&choices);
            std::__cxx11::string::~string((string *)&local_a0);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_78);
        }
        std::__cxx11::string::~string((string *)&arg);
      }
    }
  }
  else if (((OVar5 == ShortFlag) && (this->allowJoinedShortValue == true)) &&
          ((this->shortprefix)._M_string_length + 1 < (it._M_current)->_M_string_length)) {
    pcVar6 = (char *)std::__cxx11::string::at((ulong)it._M_current);
    __rhs = *pcVar6;
    choices.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
    choices.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_d0;
    choices.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d0._M_local_buf[0] = '\0';
    choices.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._1_1_ = __rhs;
    iVar4 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])(this,&choices);
    std::__cxx11::string::~string
              ((string *)
               &choices.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    if ((NamedBase *)CONCAT44(extraout_var_00,iVar4) != (NamedBase *)0x0) {
      NamedBase::HelpChoices_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_a0,(NamedBase *)CONCAT44(extraout_var_00,iVar4),&this->helpParams);
      for (; local_a0._M_dataplus._M_p != (pointer)local_a0._M_string_length;
          local_a0._M_dataplus._M_p = local_a0._M_dataplus._M_p + 0x20) {
        std::operator+(&arg,psVar8,__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&choices
                       ,&arg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_a0._M_dataplus._M_p);
        AddCompletionReply(this,it._M_current,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &choices);
        std::__cxx11::string::~string((string *)&choices);
        std::__cxx11::string::~string((string *)&arg);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_a0);
    }
  }
  std::_Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>::~_Vector_base
            (&flags.super__Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>)
  ;
LAB_00193ca4:
  std::_Vector_base<argstest::Command_*,_std::allocator<argstest::Command_*>_>::~_Vector_base
            (&commands.super__Vector_base<argstest::Command_*,_std::allocator<argstest::Command_*>_>
            );
  return true;
}

Assistant:

bool Complete(It it, It end)
            {
                auto nextIt = it;
                if (!readCompletion || (++nextIt != end))
                {
                    return false;
                }

                const auto &chunk = *it;
                auto pos = GetNextPositional();
                std::vector<Command *> commands = GetCommands();
                const auto optionType = ParseOption(chunk, true);

                if (!commands.empty() && (chunk.empty() || optionType == OptionType::Positional))
                {
                    for (auto &cmd : commands)
                    {
                        if ((cmd->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                        {
                            AddCompletionReply(chunk, cmd->Name());
                        }
                    }
                } else
                {
                    bool hasPositionalCompletion = true;

                    if (!commands.empty())
                    {
                        for (auto &cmd : commands)
                        {
                            if ((cmd->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                            {
                                AddCompletionReply(chunk, cmd->Name());
                            }
                        }
                    } else if (pos)
                    {
                        if ((pos->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                        {
                            auto choices = pos->HelpChoices(helpParams);
                            hasPositionalCompletion = !choices.empty() || optionType != OptionType::Positional;
                            for (auto &choice : choices)
                            {
                                AddCompletionReply(chunk, choice);
                            }
                        }
                    }

                    if (hasPositionalCompletion)
                    {
                        auto flags = GetAllFlags();
                        for (auto flag : flags)
                        {
                            if ((flag->GetOptions() & Options::HiddenFromCompletion) != Options::None)
                            {
                                continue;
                            }

                            auto &matcher = flag->GetMatcher();
                            if (!AddCompletionReply(chunk, matcher.GetShortOrAny().str(shortprefix, longprefix)))
                            {
                                for (auto &flagName : matcher.GetFlagStrings())
                                {
                                    if (AddCompletionReply(chunk, flagName.str(shortprefix, longprefix)))
                                    {
                                        break;
                                    }
                                }
                            }
                        }

                        if (optionType == OptionType::LongFlag && allowJoinedLongValue)
                        {
                            const auto separator = longseparator.empty() ? chunk.npos : chunk.find(longseparator);
                            if (separator != chunk.npos)
                            {
                                std::string arg(chunk, 0, separator);
                                if (auto flag = this->Match(arg.substr(longprefix.size())))
                                {
                                    for (auto &choice : flag->HelpChoices(helpParams))
                                    {
                                        AddCompletionReply(chunk, arg + longseparator + choice);
                                    }
                                }
                            }
                        } else if (optionType == OptionType::ShortFlag && allowJoinedShortValue)
                        {
                            if (chunk.size() > shortprefix.size() + 1)
                            {
                                auto arg = chunk.at(shortprefix.size());
                                //TODO: support -abcVALUE where a and b take no value
                                if (auto flag = this->Match(arg))
                                {
                                    for (auto &choice : flag->HelpChoices(helpParams))
                                    {
                                        AddCompletionReply(chunk, shortprefix + arg + choice);
                                    }
                                }
                            }
                        }
                    }
                }

#ifndef ARGS_NOEXCEPT
                throw Completion(completion->Get());
#else
                return true;
#endif
            }